

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

bool __thiscall
duckdb::StringValueScanner::SkipUntilState
          (StringValueScanner *this,CSVState initial_state,CSVState until_state,
          CSVIterator *current_iterator,bool *quoted)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  CSVState CVar1;
  char cVar2;
  ulong uVar3;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  CSVStateMachine *pCVar10;
  char *pcVar11;
  ulong uVar12;
  
  uVar3 = (current_iterator->boundary).end_pos;
  this_00 = &this->state_machine_strict;
  bVar9 = true;
  do {
    if (uVar3 <= (current_iterator->pos).buffer_pos) {
      return false;
    }
    pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    pcVar11 = (this->super_BaseScanner).buffer_handle_ptr;
    iVar4 = (current_iterator->pos).buffer_pos;
    uVar12 = iVar4 + 1;
    (current_iterator->pos).buffer_pos = uVar12;
    CVar1 = pCVar10->transition_array->state_machine[(byte)pcVar11[iVar4]][initial_state];
    switch(CVar1) {
    case STANDARD:
switchD_0189dce8_caseD_0:
      while (uVar12 + 8 < uVar3) {
        uVar12 = *(ulong *)((this->super_BaseScanner).buffer_handle_ptr + uVar12);
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar5 = pCVar10->transition_array->delimiter;
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar6 = pCVar10->transition_array->new_line;
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar7 = pCVar10->transition_array->carriage_return;
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar12 = (uVar12 ^ pCVar10->transition_array->comment) & (uVar7 ^ uVar12) &
                 (uVar6 ^ uVar12) & (uVar5 ^ uVar12);
        if ((~(0x101010101010100 - uVar12 | uVar12) & 0x8080808080808080) != 0) break;
        uVar12 = (current_iterator->pos).buffer_pos + 8;
        (current_iterator->pos).buffer_pos = uVar12;
      }
      while( true ) {
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        pcVar11 = (this->super_BaseScanner).buffer_handle_ptr;
        uVar12 = (current_iterator->pos).buffer_pos;
        if ((uVar3 - 1 <= uVar12) ||
           (pCVar10->transition_array->skip_standard[(byte)pcVar11[uVar12]] == false)) break;
        (current_iterator->pos).buffer_pos = uVar12 + 1;
      }
      uVar8 = (uint)CVar1;
      if ((uVar8 - 5 < 2) || (uVar8 == 1)) goto switchD_0189dce8_caseD_1;
      if (uVar8 == 7) goto switchD_0189dce8_caseD_7;
      break;
    case DELIMITER:
    case RECORD_SEPARATOR:
    case CARRIAGE_RETURN:
switchD_0189dce8_caseD_1:
      if ((bVar9) &&
         (cVar2 = pcVar11[uVar12 - 1],
         pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
         cVar2 == (pCVar10->dialect_options).state_machine_options.quote.value)) {
        *quoted = true;
      }
      break;
    case DELIMITER_FIRST_BYTE:
    case DELIMITER_SECOND_BYTE:
    case DELIMITER_THIRD_BYTE:
      break;
    case QUOTED:
switchD_0189dce8_caseD_7:
      while (uVar12 + 8 < uVar3) {
        uVar12 = *(ulong *)((this->super_BaseScanner).buffer_handle_ptr + uVar12);
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar5 = pCVar10->transition_array->quote;
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar12 = (uVar12 ^ pCVar10->transition_array->escape) & (uVar5 ^ uVar12);
        if ((~(0x101010101010100 - uVar12 | uVar12) & 0x8080808080808080) != 0) break;
        uVar12 = (current_iterator->pos).buffer_pos + 8;
        (current_iterator->pos).buffer_pos = uVar12;
      }
      while( true ) {
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        pcVar11 = (this->super_BaseScanner).buffer_handle_ptr;
        uVar12 = (current_iterator->pos).buffer_pos;
        if ((uVar3 - 1 <= uVar12) ||
           (pCVar10->transition_array->skip_quoted[(byte)pcVar11[uVar12]] == false)) break;
        (current_iterator->pos).buffer_pos = uVar12 + 1;
      }
      if ((CVar1 < 7) && ((0x62U >> (CVar1 & 0x1f) & 1) != 0)) goto switchD_0189dce8_caseD_1;
      break;
    default:
      if (CVar1 == STANDARD_NEWLINE) goto switchD_0189dce8_caseD_0;
    }
    if (CVar1 == until_state) {
      return true;
    }
    bVar9 = (bool)(bVar9 & initial_state != DELIMITER);
    initial_state = CVar1;
    if (CVar1 == INVALID) {
      return false;
    }
  } while( true );
}

Assistant:

bool StringValueScanner::SkipUntilState(CSVState initial_state, CSVState until_state, CSVIterator &current_iterator,
                                        bool &quoted) const {
	CSVStates current_state;
	current_state.Initialize(initial_state);
	bool first_column = true;
	const idx_t to_pos = current_iterator.GetEndPos();
	while (current_iterator.pos.buffer_pos < to_pos) {
		state_machine_strict->Transition(current_state, buffer_handle_ptr[current_iterator.pos.buffer_pos++]);
		if (current_state.IsState(CSVState::STANDARD) || current_state.IsState(CSVState::STANDARD_NEWLINE)) {
			while (current_iterator.pos.buffer_pos + 8 < to_pos) {
				uint64_t value = Load<uint64_t>(
				    reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[current_iterator.pos.buffer_pos]));
				if (ContainsZeroByte((value ^ state_machine_strict->transition_array.delimiter) &
				                     (value ^ state_machine_strict->transition_array.new_line) &
				                     (value ^ state_machine_strict->transition_array.carriage_return) &
				                     (value ^ state_machine_strict->transition_array.comment))) {
					break;
				}
				current_iterator.pos.buffer_pos += 8;
			}
			while (state_machine_strict->transition_array
			           .skip_standard[static_cast<uint8_t>(buffer_handle_ptr[current_iterator.pos.buffer_pos])] &&
			       current_iterator.pos.buffer_pos < to_pos - 1) {
				current_iterator.pos.buffer_pos++;
			}
		}
		if (current_state.IsState(CSVState::QUOTED)) {
			while (current_iterator.pos.buffer_pos + 8 < to_pos) {
				uint64_t value = Load<uint64_t>(
				    reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[current_iterator.pos.buffer_pos]));
				if (ContainsZeroByte((value ^ state_machine_strict->transition_array.quote) &
				                     (value ^ state_machine_strict->transition_array.escape))) {
					break;
				}
				current_iterator.pos.buffer_pos += 8;
			}

			while (state_machine_strict->transition_array
			           .skip_quoted[static_cast<uint8_t>(buffer_handle_ptr[current_iterator.pos.buffer_pos])] &&
			       current_iterator.pos.buffer_pos < to_pos - 1) {
				current_iterator.pos.buffer_pos++;
			}
		}
		if ((current_state.IsState(CSVState::DELIMITER) || current_state.IsState(CSVState::CARRIAGE_RETURN) ||
		     current_state.IsState(CSVState::RECORD_SEPARATOR)) &&
		    first_column) {
			if (buffer_handle_ptr[current_iterator.pos.buffer_pos - 1] ==
			    state_machine_strict->dialect_options.state_machine_options.quote.GetValue()) {
				quoted = true;
			}
		}
		if (current_state.WasState(CSVState::DELIMITER)) {
			first_column = false;
		}
		if (current_state.IsState(until_state)) {
			return true;
		}
		if (current_state.IsState(CSVState::INVALID)) {
			return false;
		}
	}
	return false;
}